

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

int __thiscall QuantNet::init(QuantNet *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  Layer *pLVar2;
  int *piVar3;
  iterator iVar4;
  pointer piVar5;
  pointer piVar6;
  int iVar7;
  pointer ppLVar8;
  long lVar9;
  size_type __new_size;
  int local_44;
  vector<int,std::allocator<int>> *local_40;
  vector<int,std::allocator<int>> *local_38;
  
  ppLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->layers->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar8) >> 3)) {
    lVar9 = 0;
    do {
      pLVar2 = ppLVar8[lVar9];
      iVar7 = std::__cxx11::string::compare((char *)&pLVar2->type);
      if (iVar7 == 0) {
        piVar3 = (pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4._M_current =
             (this->input_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->input_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->input_blobs,iVar4,piVar3);
        }
        else {
          *iVar4._M_current = *piVar3;
          (this->input_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      lVar9 = lVar9 + 1;
      ppLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar9 < (int)((ulong)((long)(this->layers->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar8
                                  ) >> 3));
  }
  local_44 = 0;
  ppLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->layers->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar8) >> 3)) {
    local_38 = (vector<int,std::allocator<int>> *)&this->conv_layers;
    local_40 = (vector<int,std::allocator<int>> *)&this->conv_bottom_blobs;
    do {
      pLVar2 = ppLVar8[local_44];
      psVar1 = &pLVar2->type;
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar7 == 0) {
LAB_00128cd2:
        iVar4._M_current =
             (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_38,iVar4,&local_44);
        }
        else {
          *iVar4._M_current = local_44;
          (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4._M_current =
             (this->conv_bottom_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->conv_bottom_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_40,iVar4,piVar3)
          ;
        }
        else {
          *iVar4._M_current = *piVar3;
          (this->conv_bottom_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        piVar3 = (pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4._M_current =
             (this->conv_top_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->conv_top_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->conv_top_blobs,iVar4,piVar3);
        }
        else {
          *iVar4._M_current = *piVar3;
          (this->conv_top_blobs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar7 == 0) goto LAB_00128cd2;
        iVar7 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar7 == 0) goto LAB_00128cd2;
      }
      local_44 = local_44 + 1;
      ppLVar8 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (local_44 <
             (int)((ulong)((long)(this->layers->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar8) >> 3));
  }
  piVar5 = (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (size_type)
               (int)((ulong)((long)(this->conv_bottom_blobs).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->conv_bottom_blobs).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
  std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::resize
            (&this->quant_blob_stats,__new_size);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
            (&this->weight_scales,(long)(int)((ulong)((long)piVar5 - (long)piVar6) >> 2));
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&this->bottom_blob_scales,__new_size);
  return 0;
}

Assistant:

int QuantNet::init()
{
    // find all input layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Input")
        {
            input_blobs.push_back(layer->tops[0]);
        }
    }

    // find all conv layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            conv_layers.push_back(i);
            conv_bottom_blobs.push_back(layer->bottoms[0]);
            conv_top_blobs.push_back(layer->tops[0]);
        }
    }

    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();

    quant_blob_stats.resize(conv_bottom_blob_count);
    weight_scales.resize(conv_layer_count);
    bottom_blob_scales.resize(conv_bottom_blob_count);

    return 0;
}